

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImageHandler.cpp
# Opt level: O1

int __thiscall ImageHandler::doTask(ImageHandler *this)

{
  element_type *peVar1;
  element_type *peVar2;
  int iVar3;
  int iVar4;
  vector<Object,_std::allocator<Object>_> objects;
  vector<Object,_std::allocator<Object>_> local_38;
  
  local_38.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_38.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_38.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  peVar1 = (this->super_MediaHandler).m_detector.
           super___shared_ptr<Detector,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  iVar3 = (*peVar1->_vptr_Detector[2])(peVar1,&this->m_img,&local_38,&this->m_targetName);
  iVar4 = -1;
  if (iVar3 == 0) {
    peVar2 = (this->super_MediaHandler).m_effect.
             super___shared_ptr<Effect,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    iVar4 = (*peVar2->_vptr_Effect[2])(peVar2,&this->m_img,&local_38);
    iVar4 = -(uint)(iVar4 != 0);
  }
  std::vector<Object,_std::allocator<Object>_>::~vector(&local_38);
  return iVar4;
}

Assistant:

int ImageHandler::doTask() 
{
    std::vector<Object> objects;

    int ret = m_detector->detect(m_img, objects, m_targetName);
    if (ret != 0) 
    {
        return -1;
    }
    //ret = m_detector->draw(m_img, objects);

    ret = m_effect->draw(m_img, objects);
    if (ret != 0) 
    {
        return -1;
    }

    return 0;
}